

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_band.c
# Opt level: O1

void bandCopy(realtype **a,realtype **b,sunindextype n,sunindextype a_smu,sunindextype b_smu,
             sunindextype copymu,sunindextype copyml)

{
  realtype *prVar1;
  realtype *prVar2;
  long lVar3;
  long lVar4;
  
  if (0 < n) {
    lVar3 = 0;
    do {
      if (-1 < copyml + copymu) {
        prVar1 = a[lVar3];
        prVar2 = b[lVar3];
        lVar4 = -copymu;
        do {
          prVar2[b_smu + lVar4] = prVar1[a_smu + lVar4];
          lVar4 = lVar4 + 1;
        } while (copyml + 1 != lVar4);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != n);
  }
  return;
}

Assistant:

void bandCopy(realtype **a, realtype **b, sunindextype n, sunindextype a_smu, sunindextype b_smu, 
              sunindextype copymu, sunindextype copyml)
{
  sunindextype i, j, copySize;
  realtype *a_col_j, *b_col_j;

  copySize = copymu + copyml + 1;
 
  for (j=0; j < n; j++) {
    a_col_j = a[j]+a_smu-copymu;
    b_col_j = b[j]+b_smu-copymu;
    for (i=0; i < copySize; i++)
      b_col_j[i] = a_col_j[i];
  }
}